

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

void __thiscall CChat::OnMessage(CChat *this,int MsgType,void *pRawMsg)

{
  undefined8 uVar1;
  int iVar2;
  CConfig *pCVar3;
  CCommandManager *in_RDX;
  int in_ESI;
  char *in_RDI;
  char *unaff_retaddr;
  CNetMsg_Sv_CommandInfoRemove *pMsg_2;
  CNetMsg_Sv_CommandInfo *pMsg_1;
  CNetMsg_Sv_Chat *pMsg;
  int in_stack_0000004c;
  int in_stack_00000050;
  int in_stack_00000054;
  char *in_stack_00000058;
  CChat *in_stack_00000060;
  char *in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 3) {
    if ((*(int *)&(in_RDX->m_aCommands).list != 3) ||
       (pCVar3 = CComponent::Config((CComponent *)0x14f163), pCVar3->m_ClDisableWhisper == 0)) {
      AddLine(in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000050,
              in_stack_0000004c);
    }
  }
  else if (in_ESI == 0x25) {
    iVar2 = CCommandManager::AddCommand
                      ((CCommandManager *)pMsg_1,(char *)pMsg_2,unaff_retaddr,in_RDI,
                       (FCommandCallback)CONCAT44(0x25,in_stack_fffffffffffffff0),in_RDX);
    if (iVar2 == 0) {
      uVar1._0_4_ = (in_RDX->m_aCommands).list_size;
      uVar1._4_4_ = (in_RDX->m_aCommands).num_elements;
      dbg_msg("chat_commands","adding server chat command: name=\'%s\' args=\'%s\' help=\'%s\'",
              (in_RDX->m_aCommands).list,uVar1,in_RDX->m_pConsole);
    }
    else {
      dbg_msg("chat_commands","failed to add command \'%s\'",(in_RDX->m_aCommands).list);
    }
  }
  else if ((in_ESI == 0x26) &&
          (iVar2 = CCommandManager::RemoveCommand(in_RDX,in_stack_ffffffffffffffe0), iVar2 == 0)) {
    dbg_msg("chat_commands","removed chat command: name=\'%s\'",(in_RDX->m_aCommands).list);
  }
  return;
}

Assistant:

void CChat::OnMessage(int MsgType, void *pRawMsg)
{
	if(MsgType == NETMSGTYPE_SV_CHAT)
	{
		CNetMsg_Sv_Chat *pMsg = (CNetMsg_Sv_Chat *)pRawMsg;
		if(pMsg->m_Mode == CHAT_WHISPER && Config()->m_ClDisableWhisper)
			return;
		AddLine(pMsg->m_pMessage, pMsg->m_ClientID, pMsg->m_Mode, pMsg->m_TargetID);
	}
	else if(MsgType == NETMSGTYPE_SV_COMMANDINFO)
	{
		CNetMsg_Sv_CommandInfo *pMsg = (CNetMsg_Sv_CommandInfo *)pRawMsg;
		if(!m_CommandManager.AddCommand(pMsg->m_Name, pMsg->m_HelpText, pMsg->m_ArgsFormat, ServerCommandCallback, this))
			dbg_msg("chat_commands", "adding server chat command: name='%s' args='%s' help='%s'", pMsg->m_Name, pMsg->m_ArgsFormat, pMsg->m_HelpText);
		else
			dbg_msg("chat_commands", "failed to add command '%s'", pMsg->m_Name);

	}
	else if(MsgType == NETMSGTYPE_SV_COMMANDINFOREMOVE)
	{
		CNetMsg_Sv_CommandInfoRemove *pMsg = (CNetMsg_Sv_CommandInfoRemove *)pRawMsg;

		if(!m_CommandManager.RemoveCommand(pMsg->m_Name))
		{
			dbg_msg("chat_commands", "removed chat command: name='%s'", pMsg->m_Name);
		}
	}
}